

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O2

ND_BOOL ShemuBmpStateCheck(ND_UINT8 *Bitmap,ND_UINT64 Size,ND_UINT64 Start,ND_UINT64 Count,
                          ND_UINT8 Flags)

{
  long lVar1;
  ND_BOOL NVar2;
  ND_UINT64 NVar3;
  
  if (Size < Count + Start || (Size < Count || (Size <= Start || Bitmap == (ND_UINT8 *)0x0))) {
LAB_00163dd8:
    NVar2 = '\0';
  }
  else {
    NVar3 = 0;
    do {
      if (Count == NVar3) goto LAB_00163dd8;
      lVar1 = NVar3 + Start;
      NVar3 = NVar3 + 1;
    } while ((Bitmap[lVar1] & Flags) == 0);
    NVar2 = '\x01';
  }
  return NVar2;
}

Assistant:

ND_BOOL
ShemuBmpStateCheck(
    ND_UINT8 *Bitmap,
    ND_UINT64 Size,
    ND_UINT64 Start,
    ND_UINT64 Count,
    ND_UINT8 Flags
    )
//
// Check if any of the state bytes in the Bitmap has any of the Flags set.
// 
// @returns ND_TRUE if any state byte contains the indicated Flags.
//
{
    ND_UINT64 i;

    if (ND_NULL == Bitmap || Start >= Size || Count > Size || Start + Count > Size)
    {
        return ND_FALSE;
    }

    for (i = 0; i < Count; i++)
    {
        if (Bitmap[Start + i] & Flags)
        {
            return ND_TRUE;
        }
    }

    return ND_FALSE;
}